

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O3

Vec_Int_t * Mio_SopCoverOr(Vec_Int_t *p,Vec_Int_t *q)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = p->nSize;
  iVar4 = q->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < (iVar4 + iVar1) - 1U) {
    iVar3 = iVar4 + iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  p_00->pArray = piVar2;
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      Vec_IntPush(p_00,p->pArray[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->nSize);
    iVar4 = q->nSize;
  }
  if (0 < iVar4) {
    lVar5 = 0;
    do {
      Mio_SopPushSCC(p_00,q->pArray[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < q->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mio_SopCoverOr( Vec_Int_t * p, Vec_Int_t * q )
{
    Vec_Int_t * r;
    unsigned Entry;
    int i;
    r = Vec_IntAlloc( Vec_IntSize(p) + Vec_IntSize(q) );
    Vec_IntForEachEntry( p, Entry, i )
        Vec_IntPush( r, Entry );
    Vec_IntForEachEntry( q, Entry, i )
        Mio_SopPushSCC( r, Entry );
    return r;
}